

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZHighLevelEncoder.cpp
# Opt level: O2

list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> *
ZXing::Aztec::SimplifyStates
          (list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
           *__return_storage_ptr__,
          list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> *states)

{
  EncodingState *__x;
  bool bVar1;
  iterator __position;
  _List_node_base *p_Var2;
  
  (__return_storage_ptr__->
  super__List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>).
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>).
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>).
  _M_impl._M_node._M_size = 0;
  p_Var2 = (_List_node_base *)states;
LAB_001618a6:
  do {
    p_Var2 = (((_List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)states) {
      return __return_storage_ptr__;
    }
    __x = (EncodingState *)(p_Var2 + 1);
    __position._M_node =
         (__return_storage_ptr__->
         super__List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
         )._M_impl._M_node.super__List_node_base._M_next;
    while (__position._M_node != (_List_node_base *)__return_storage_ptr__) {
      bVar1 = IsBetterThanOrEqualTo((EncodingState *)(__position._M_node + 1),__x);
      if (bVar1) goto LAB_001618a6;
      bVar1 = IsBetterThanOrEqualTo(__x,(EncodingState *)(__position._M_node + 1));
      if (bVar1) {
        __position = std::__cxx11::
                     list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                     ::erase(__return_storage_ptr__,__position._M_node);
      }
      else {
        __position._M_node = (__position._M_node)->_M_next;
      }
    }
    std::__cxx11::list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
    push_back(__return_storage_ptr__,__x);
  } while( true );
}

Assistant:

static std::list<EncodingState> SimplifyStates(const std::list<EncodingState>& states)
{
	std::list<EncodingState> result;
	for (auto& newState : states) {
		bool add = true;
		for (auto iterator = result.begin(); iterator != result.end();) {
			auto& oldState = *iterator;
			if (IsBetterThanOrEqualTo(oldState, newState)) {
				add = false;
				break;
			}
			if (IsBetterThanOrEqualTo(newState, oldState)) {
				iterator = result.erase(iterator);
			}
			else {
				++iterator;
			}
		}
		if (add) {
			result.push_back(newState);
		}
	}
	return result;
}